

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_object.hpp
# Opt level: O2

void __thiscall
webfront::http::std::experimental::net::v1::
basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
::~basic_io_object(basic_io_object<std::experimental::net::v1::detail::resolver_service<std::experimental::net::v1::ip::tcp>,_true>
                   *this)

{
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  __shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->implementation_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~basic_io_object()
  {
    service_->destroy(implementation_);
  }